

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O3

int32_t rtosc_convert_to_range
                  (rtosc_arg_val_t *arg,size_t size,rtosc_arg_val_t *arg_out,
                  rtosc_print_options *opt)

{
  rtosc_arg_val_t *arg_00;
  char cVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  long lVar6;
  rtosc_arg_val_t *prVar7;
  long lVar8;
  size_t i;
  ulong uVar9;
  ulong uVar10;
  rtosc_arg_val_t delta;
  rtosc_arg_val_t added;
  rtosc_arg_val_t local_60;
  rtosc_arg_val_t local_48;
  
  uVar9 = 0;
  if (((size < 5) || (cVar1 = arg->type, cVar1 == '-')) || (opt->compress_ranges == 0))
  goto LAB_0010e10b;
  uVar9 = 0;
  uVar10 = 0;
  do {
    if (cVar1 != arg[uVar9].type) break;
    lVar6 = 1;
    if (cVar1 == 'a') {
      iVar2 = rtosc_av_arr_len(arg + uVar9);
      lVar6 = (long)(iVar2 + 1);
    }
    uVar9 = uVar9 + lVar6;
    uVar10 = uVar10 + 1;
  } while (uVar9 < size);
  uVar9 = 0;
  if (uVar10 < 5) goto LAB_0010e10b;
  lVar6 = 1;
  if (arg->type == 'a') {
    iVar2 = rtosc_av_arr_len(arg);
    lVar6 = (long)(iVar2 + 1);
  }
  lVar8 = 0;
  iVar3 = rtosc_arg_vals_eq_single(arg,arg + lVar6,(rtosc_cmp_options *)0x0);
  if (iVar3 == 0) {
    pvVar5 = memchr("cihTF",(int)arg->type,6);
    if (pvVar5 != (void *)0x0) {
      rtosc_arg_val_sub(arg + 1,arg,&local_60);
      lVar8 = 1;
      goto LAB_0010dfea;
    }
  }
  else {
LAB_0010dfea:
    uVar9 = 1;
    if (arg->type == 'a') {
      iVar2 = rtosc_av_arr_len(arg);
      uVar9 = (ulong)(iVar2 + 1);
    }
    prVar7 = arg;
    if (iVar3 == 0) {
      prVar7 = &local_48;
    }
    uVar10 = 2;
    while( true ) {
      arg_00 = arg + (int)uVar9;
      lVar6 = 1;
      if (arg_00->type == 'a') {
        iVar2 = rtosc_av_arr_len(arg_00);
        lVar6 = (long)(iVar2 + 1);
      }
      if (iVar3 == 0) {
        rtosc_arg_val_add(arg_00,&local_60,&local_48);
      }
      uVar9 = lVar6 + (int)uVar9;
      if (size <= uVar9) break;
      iVar4 = rtosc_arg_vals_eq_single(prVar7,arg + uVar9,(rtosc_cmp_options *)0x0);
      if (iVar4 == 0) break;
      uVar10 = uVar10 + 1;
    }
    if (4 < uVar10) {
      insert_arg_range(arg_out,(int32_t)uVar10,arg,(int)lVar8,&local_60,0,0);
      lVar6 = 1;
      if (arg->type == 'a') {
        iVar2 = rtosc_av_arr_len(arg);
        lVar6 = (long)(iVar2 + 1);
      }
      prVar7 = arg_out + lVar8 + lVar6 + 1;
      prVar7->type = ' ';
      rtosc_av_arr_len_set
                (prVar7,(int)((ulong)((long)prVar7 - (long)arg_out) >> 3) * 0x55555555 + (int)uVar9
                        + -1);
      goto LAB_0010e10b;
    }
  }
  uVar9 = 0;
LAB_0010e10b:
  return (int32_t)uVar9;
}

Assistant:

static int32_t rtosc_convert_to_range(const rtosc_arg_val_t* const arg,
                                      size_t size,
                                      rtosc_arg_val_t* arg_out,
                                      const rtosc_print_options* opt)
{
    if(size < range_min || arg[0].type == '-' || !opt->compress_ranges)
        return 0;
    char type = arg->type;
    size_t num_common = 0;
    for(size_t i = 0; i < size; i += incsize(arg+i), ++num_common)
    {
        if(type != arg[i].type)
            break;
    }
    if(num_common < range_min)
        return 0;

    int32_t skipped;
    num_common = 1;
    int has_delta;
    rtosc_arg_val_t delta, added;

    if(rtosc_arg_vals_eq_single(arg, arg + incsize(arg), NULL))
        has_delta = 0;
    else if(strchr(numeric_range_convertible_types(), arg->type)) {
        has_delta = 1;
        rtosc_arg_val_sub(arg+1, arg, &delta);
    }
    else return 0;

    {
        int go_on = 1;
        size_t next;
        for(skipped = incsize(arg); go_on; skipped = next, ++num_common)
        {
            next = skipped + incsize(arg+skipped);

            if(has_delta)
                rtosc_arg_val_add(arg+skipped, &delta, &added);

            if(next >= size || !rtosc_arg_vals_eq_single(has_delta ? &added
                                                                   : arg,
                                                         arg+next, NULL))
                go_on = false;
        }
    }

    if(num_common >= range_min)
    {
        insert_arg_range(arg_out, num_common, arg, has_delta, &delta,
                         false, false);
        const rtosc_arg_val_t* old_arg_out = arg_out;
        arg_out += 1 + has_delta;
        arg_out += incsize(arg);
        arg_out->type = ' ';
        rtosc_av_arr_len_set(arg_out, skipped - (arg_out - old_arg_out) - 1);
        return skipped;
    }
    else
        return 0;
}